

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

Symbol * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::rewireIfaceArrayIndices
          (PortConnectionBuilder *this,Symbol *sym,string_view name,SourceLocation loc,
          span<const_slang::ConstantRange,_18446744073709551615UL> portDims)

{
  string_view name_00;
  string_view name_01;
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  uint uVar4;
  InstanceArraySymbol *this_00;
  reference this_01;
  char *in_RDX;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  PortConnectionBuilder *in_RSI;
  SourceLocation in_RDI;
  size_t in_R8;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> sVar5;
  span<const_slang::ConstantRange,_18446744073709551615UL> in_stack_00000000;
  Symbol *elem_1;
  iterator __end4_1;
  iterator __begin4_1;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *__range4_1;
  Symbol *elem;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>_>
  __end4;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>_>
  __begin4;
  reverse_view<std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_> *__range4;
  InstanceArraySymbol *arr;
  SmallVector<const_slang::ast::Symbol_*,_5UL> newElems;
  span<const_slang::ConstantRange,_18446744073709551615UL> subPortDims;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *in_stack_fffffffffffffdf8;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *item;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe00;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *in_stack_fffffffffffffe08;
  span<const_slang::ConstantRange,_18446744073709551615UL> *in_stack_fffffffffffffe10;
  ConstantRange *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe58;
  pointer in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe6c;
  __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
  local_118;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *local_110;
  pointer local_108;
  size_t sStack_100;
  Symbol *local_d0;
  ConstantRange local_c8;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> local_b0;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *local_a0;
  InstanceArraySymbol *local_88;
  SmallVectorBase<const_slang::ast::Symbol_*> local_80 [2];
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *local_40;
  __extent_storage<18446744073709551615UL> sym_00;
  SourceLocation loc_00;
  PortConnectionBuilder *local_8;
  
  local_8 = in_RSI;
  if ((in_RSI != (PortConnectionBuilder *)0x0) &&
     (((Symbol *)&in_RSI->scope)->kind == InstanceArray)) {
    loc_00 = in_RDI;
    _local_40 = std::span<const_slang::ConstantRange,_18446744073709551615UL>::subspan
                          (in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08,
                           in_stack_fffffffffffffe00._M_extent_value);
    SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x6cae36);
    this_00 = Symbol::as<slang::ast::InstanceArraySymbol>((Symbol *)0x6cae43);
    local_88 = this_00;
    uVar1 = ConstantRange::isLittleEndian(&this_00->range);
    uVar4 = (uint)(byte)uVar1;
    this_01 = std::span<const_slang::ConstantRange,_18446744073709551615UL>::operator[]
                        ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
                         &stack0x00000008,0);
    uVar2 = ConstantRange::isLittleEndian(this_01);
    if (uVar4 == (byte)uVar2) {
      local_110 = &local_88->elements;
      local_118._M_current =
           (Symbol **)
           std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                     (in_stack_fffffffffffffdf8);
      std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::end
                (in_stack_fffffffffffffe08);
      while( true ) {
        bVar3 = __gnu_cxx::
                operator==<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffe00._M_extent_value,
                           (__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffdf8);
        sVar5._M_extent._M_extent_value = in_stack_fffffffffffffe58._M_extent_value;
        sVar5._M_ptr = in_stack_fffffffffffffe60;
        src = extraout_RDX_00;
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
        ::operator*(&local_118);
        name_01._M_str = in_RDX;
        name_01._M_len = in_R8;
        in_stack_fffffffffffffdf8 = local_40;
        in_stack_fffffffffffffe00._M_extent_value = sym_00._M_extent_value;
        rewireIfaceArrayIndices
                  (in_RSI,(Symbol *)sym_00._M_extent_value,name_01,loc_00,in_stack_00000000);
        SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Symbol_*> *)
                   in_stack_fffffffffffffe00._M_extent_value,(Symbol **)in_stack_fffffffffffffdf8);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
        ::operator++(&local_118);
      }
    }
    else {
      sVar5 = (span<const_slang::ast::Symbol_*const,_18446744073709551615UL>)
              std::ranges::views::_Reverse::
              operator()<const_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_&>
                        ((_Reverse *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      local_a0 = &local_b0;
      local_b0 = sVar5;
      std::ranges::reverse_view<std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
      ::begin((reverse_view<std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_> *)
              in_stack_fffffffffffffe08);
      std::ranges::reverse_view<std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
      ::end((reverse_view<std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_> *)
            in_stack_fffffffffffffe08);
      while( true ) {
        in_stack_fffffffffffffe57 =
             std::
             operator==<__gnu_cxx::__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>_>
                       ((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffffe10,
                        (reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffffe08);
        src = extraout_RDX;
        if (((in_stack_fffffffffffffe57 ^ 0xff) & 1) == 0) break;
        in_stack_fffffffffffffe48 =
             (ConstantRange *)
             std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>_>
                          *)in_stack_fffffffffffffe00._M_extent_value);
        local_c8 = *in_stack_fffffffffffffe48;
        local_108 = (pointer)local_40;
        name_00._M_str = in_RDX;
        name_00._M_len = in_R8;
        item = local_40;
        in_stack_fffffffffffffe00._M_extent_value = sym_00._M_extent_value;
        sStack_100 = sym_00._M_extent_value;
        local_d0 = rewireIfaceArrayIndices
                             (in_RSI,(Symbol *)sym_00._M_extent_value,name_00,loc_00,
                              in_stack_00000000);
        SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Symbol_*> *)
                   in_stack_fffffffffffffe00._M_extent_value,(Symbol **)item);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffe00._M_extent_value);
      }
    }
    SmallVectorBase<const_slang::ast::Symbol_*>::copy
              (local_80,*(EVP_PKEY_CTX **)((long)in_RDI + 0x10),src);
    std::span<const_slang::ConstantRange,_18446744073709551615UL>::operator[]
              ((span<const_slang::ConstantRange,_18446744073709551615UL> *)&stack0x00000008,0);
    local_8 = (PortConnectionBuilder *)
              BumpAllocator::
              emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::ConstantRange_const&>
                        ((BumpAllocator *)this_00,
                         (Compilation *)
                         CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe6c,uVar4))),
                         (basic_string_view<char,_std::char_traits<char>_> *)sVar5._M_ptr,
                         (SourceLocation *)sVar5._M_extent._M_extent_value._M_extent_value,
                         (span<const_slang::ast::Symbol_*,_18446744073709551615UL> *)
                         CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe48);
    SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x6cb221);
  }
  return (Symbol *)local_8;
}

Assistant:

const Symbol* rewireIfaceArrayIndices(const Symbol* sym, std::string_view name,
                                          SourceLocation loc,
                                          std::span<const ConstantRange> portDims) {
        if (!sym || sym->kind != SymbolKind::InstanceArray)
            return sym;

        // The port dimensions are guaranteed to have the same count and width as
        // the instance array dimensions but their indices may differ, so this
        // function creates a new array with the correct range.
        SLANG_ASSERT(!portDims.empty());
        auto subPortDims = portDims.subspan(1);

        SmallVector<const Symbol*> newElems;
        auto& arr = sym->as<InstanceArraySymbol>();
        if (arr.range.isLittleEndian() != portDims[0].isLittleEndian()) {
            for (auto elem : std::views::reverse(arr.elements))
                newElems.push_back(rewireIfaceArrayIndices(elem, name, loc, subPortDims));
        }
        else {
            for (auto elem : arr.elements)
                newElems.push_back(rewireIfaceArrayIndices(elem, name, loc, subPortDims));
        }

        return comp.emplace<InstanceArraySymbol>(comp, name, loc, newElems.copy(comp), portDims[0]);
    }